

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcException.h
# Opt level: O0

void __thiscall
XmlRpc::XmlRpcException::XmlRpcException(XmlRpcException *this,XmlRpcException *param_2)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x20);
  return;
}

Assistant:

class XMLRPCPP_DECL XmlRpcException {
  public:
    //! Constructor
    //!   @param message  A descriptive error message
    //!   @param code     An integer error code
    XmlRpcException(const std::string& message, int code=-1) :
        _message(message), _code(code) {}

    //! Return the error message.
    const std::string& getMessage() const { return _message; }

    //! Return the error code.
    int getCode() const { return _code; }

  private:
    std::string _message;
    int _code;
  }